

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  string_view sVar1;
  InlinedStringField *pIVar2;
  InlinedStringField *arena;
  Arena *arena_00;
  bool bVar3;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  string *psVar7;
  uint uVar8;
  uint uVar9;
  string local_c0 [8];
  string temp;
  uint32_t mask;
  bool rhs_arena_dtor_registered;
  bool lhs_arena_dtor_registered;
  uint32_t *rhs_state;
  uint32_t *lhs_state;
  uint32_t *rhs_array;
  uint32_t *lhs_array;
  Voidify local_61;
  uint local_60;
  uint local_5c;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  InlinedStringField *pIStack_48;
  uint32_t index;
  InlinedStringField *rhs_string;
  InlinedStringField *lhs_string;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  lhs_arena = (Arena *)field;
  field_local = (FieldDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)r;
  rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
  lhs_string = (InlinedStringField *)MessageLite::GetArena((MessageLite *)field_local);
  rhs_string = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>
                         ((Reflection *)lhs_local,rhs_local,(FieldDescriptor *)lhs_arena);
  pIStack_48 = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>
                         ((Reflection *)lhs_local,(Message *)field_local,
                          (FieldDescriptor *)lhs_arena);
  absl_log_internal_check_op_result._4_4_ =
       ReflectionSchema::InlinedStringIndex
                 ((ReflectionSchema *)&(lhs_local->super_MessageLite)._internal_metadata_,
                  (FieldDescriptor *)lhs_arena);
  local_5c = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_60 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_58 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                       (&local_5c,&local_60,"index > 0u");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&lhs_array,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x2b7,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&lhs_array);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&lhs_array);
  }
  puVar5 = Reflection::MutableInlinedStringDonatedArray((Reflection *)lhs_local,rhs_local);
  puVar6 = Reflection::MutableInlinedStringDonatedArray
                     ((Reflection *)lhs_local,(Message *)field_local);
  uVar8 = absl_log_internal_check_op_result._4_4_ >> 5;
  uVar9 = absl_log_internal_check_op_result._4_4_ >> 5;
  temp.field_2._M_local_buf[0xf] = (*puVar5 & 1) == 0;
  temp.field_2._M_local_buf[0xe] = (*puVar6 & 1) == 0;
  temp.field_2._8_4_ =
       -2 << (absl_log_internal_check_op_result._4_1_ & 0x1f) |
       0xfffffffeU >> 0x20 - (absl_log_internal_check_op_result._4_1_ & 0x1f);
  psVar7 = InlinedStringField::Get_abi_cxx11_(rhs_string);
  std::__cxx11::string::string(local_c0,(string *)psVar7);
  pIVar2 = rhs_string;
  psVar7 = InlinedStringField::Get_abi_cxx11_(pIStack_48);
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
  arena_00 = rhs_arena;
  bVar3 = Reflection::IsInlinedStringDonated
                    ((Reflection *)lhs_local,rhs_local,(FieldDescriptor *)lhs_arena);
  InlinedStringField::Set
            (pIVar2,sVar1,arena_00,bVar3,puVar5 + uVar8,temp.field_2._8_4_,
             &rhs_local->super_MessageLite);
  pIVar2 = pIStack_48;
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c0);
  arena = lhs_string;
  bVar3 = Reflection::IsInlinedStringDonated
                    ((Reflection *)lhs_local,(Message *)field_local,(FieldDescriptor *)lhs_arena);
  InlinedStringField::Set
            (pIVar2,sVar1,(Arena *)arena,bVar3,puVar6 + uVar9,temp.field_2._8_4_,
             (MessageLite *)field_local);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}